

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::AddBranch(ON_RTree *this,ON_RTreeBranch *a_branch,ON_RTreeNode *a_node,
                   ON_RTreeNode **a_newNode)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  
  iVar2 = a_node->m_count;
  lVar8 = (long)iVar2;
  if (lVar8 < 6) {
    a_node->m_branch[lVar8].field_1 = a_branch->field_1;
    dVar3 = (a_branch->m_rect).m_min[0];
    dVar4 = (a_branch->m_rect).m_min[1];
    dVar5 = (a_branch->m_rect).m_min[2];
    dVar6 = (a_branch->m_rect).m_max[0];
    dVar7 = (a_branch->m_rect).m_max[2];
    pdVar1 = a_node->m_branch[lVar8].m_rect.m_max + 1;
    *pdVar1 = (a_branch->m_rect).m_max[1];
    pdVar1[1] = dVar7;
    pdVar1 = a_node->m_branch[lVar8].m_rect.m_min + 2;
    *pdVar1 = dVar5;
    pdVar1[1] = dVar6;
    a_node->m_branch[lVar8].m_rect.m_min[0] = dVar3;
    a_node->m_branch[lVar8].m_rect.m_min[1] = dVar4;
    a_node->m_count = a_node->m_count + 1;
  }
  else {
    SplitNode(this,a_node,a_branch,a_newNode);
  }
  return 5 < iVar2;
}

Assistant:

bool ON_RTree::AddBranch(ON_RTreeBranch* a_branch, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode)
{
  if(a_node->m_count < ON_RTree_MAX_NODE_COUNT)  // Split won't be necessary
  {
    a_node->m_branch[a_node->m_count] = *a_branch;
    ++a_node->m_count;

    return false;
  }
  else
  {
    SplitNode(a_node, a_branch, a_newNode);
    return true;
  }
}